

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  ArrayIndex AVar2;
  string sStack_1e8;
  ostringstream oss;
  Value local_50;
  
  if (this->field_0x8 == '\0') {
    Value(&local_50,arrayValue);
    swap(this,&local_50);
    ~Value(&local_50);
  }
  else if (this->field_0x8 != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1e8);
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar1 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  for (AVar2 = newSize; AVar1 != AVar2; AVar2 = AVar2 + 1) {
    _oss = (char *)0x0;
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase(&((this->value_).map_)->_M_t,(CZString *)&oss);
    CZString::~CZString((CZString *)&oss);
  }
  AVar1 = size(this);
  if (AVar1 == newSize) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&oss,"assert json failed",(allocator<char> *)&sStack_1e8);
  throwLogicError((string *)&oss);
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}